

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

void duckdb::CAPIAggregateUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,Vector *state,
               idx_t count)

{
  FunctionData *pFVar1;
  InvalidInputException *this;
  bool bVar2;
  CAggregateExecuteInfo exec_info;
  DataChunk chunk;
  
  DataChunk::DataChunk(&chunk);
  while (bVar2 = input_count != 0, input_count = input_count - 1, bVar2) {
    Vector::Flatten(inputs,count);
    ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
              ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&chunk,inputs);
    inputs = inputs + 1;
  }
  chunk.count = count;
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  exec_info.info = (CAggregateFunctionInfo *)pFVar1[1]._vptr_FunctionData;
  exec_info.success = true;
  exec_info.error._M_dataplus._M_p = (pointer)&exec_info.error.field_2;
  exec_info.error._M_string_length = 0;
  exec_info.error.field_2._M_local_buf[0] = '\0';
  (*(exec_info.info)->update)(&exec_info,&chunk,state->data);
  if (exec_info.success != false) {
    ::std::__cxx11::string::~string((string *)&exec_info.error);
    DataChunk::~DataChunk(&chunk);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,(string *)&exec_info.error);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CAPIAggregateUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, Vector &state,
                         idx_t count) {
	DataChunk chunk;
	for (idx_t c = 0; c < input_count; c++) {
		inputs[c].Flatten(count);
		chunk.data.emplace_back(inputs[c]);
	}
	chunk.SetCardinality(count);

	auto &bind_data = aggr_input_data.bind_data->Cast<CAggregateFunctionBindData>();
	auto state_data = FlatVector::GetData<duckdb_aggregate_state>(state);
	auto c_input_chunk = reinterpret_cast<duckdb_data_chunk>(&chunk);

	CAggregateExecuteInfo exec_info(bind_data.info);
	auto c_function_info = reinterpret_cast<duckdb_function_info>(&exec_info);
	bind_data.info.update(c_function_info, c_input_chunk, state_data);
	if (!exec_info.success) {
		throw InvalidInputException(exec_info.error);
	}
}